

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdMicroAllocator.cpp
# Opt level: O3

void * __thiscall HACD::MyMicroAllocator::malloc(MyMicroAllocator *this,size_t __size)

{
  void *pvVar1;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->super_MemMutex);
  if (__size < 0x101) {
    pvVar1 = FixedMemory::allocate(this->mFixedAllocators[__size],&this->super_MicroChunkUpdate);
    pthread_mutex_unlock((pthread_mutex_t *)&this->super_MemMutex);
    return pvVar1;
  }
  __assert_fail("size <= 256",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACD/hacdMicroAllocator.cpp"
                ,0x1c8,"virtual void *HACD::MyMicroAllocator::malloc(size_t)");
}

Assistant:

virtual void * malloc(size_t size)
  {
    void *ret = 0;
	Lock();
   assert( size <= 256 );
   if ( size <= 256 )
   {
     ret = mFixedAllocators[size]->allocate(this);
   }
   Unlock();
    return ret;
  }